

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::quatf>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *result)

{
  pointer *ppqVar1;
  pointer pqVar2;
  iterator iVar3;
  StreamReader *pSVar4;
  quatf qVar5;
  float3 fVar6;
  quatf qVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  int iVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  char c;
  float4 v;
  char local_69;
  quatf local_68;
  undefined1 local_58 [8];
  size_type sStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  pqVar2 = (result->
           super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
      _M_impl.super__Vector_impl_data._M_finish != pqVar2) {
    (result->super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
    _M_impl.super__Vector_impl_data._M_finish = pqVar2;
  }
  bVar10 = SkipWhitespaceAndNewline(this,true);
  if (bVar10) {
    bVar10 = ParseBasicTypeTuple<float,4ul>(this,(array<float,_4UL> *)local_58);
    if (bVar10) {
      auVar8._8_8_ = sStack_50;
      auVar8._0_8_ = CONCAT71(local_58._1_7_,local_58[0]);
      fVar6._M_elems = auVar8._4_12_;
      qVar5.real = (float)CONCAT71(local_58._1_7_,local_58[0]);
      qVar5.imag._M_elems[0] = fVar6._M_elems[0];
      qVar5.imag._M_elems[1] = fVar6._M_elems[1];
      qVar5.imag._M_elems[2] = fVar6._M_elems[2];
      iVar3._M_current =
           (result->
           super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      local_68 = qVar5;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>::
        _M_realloc_insert<tinyusdz::value::quatf_const&>
                  ((vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>> *)result,
                   iVar3,&local_68);
      }
      else {
        local_68.imag._M_elems._0_8_ = auVar8._4_8_;
        local_68._8_8_ = qVar5._8_8_;
        *(undefined8 *)((iVar3._M_current)->imag)._M_elems = local_68.imag._M_elems._0_8_;
        *(undefined8 *)(((iVar3._M_current)->imag)._M_elems + 2) = local_68._8_8_;
        ppqVar1 = &(result->
                   super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppqVar1 = *ppqVar1 + 1;
      }
      do {
        pSVar4 = this->_sr;
        if ((pSVar4->length_ <= pSVar4->idx_) || (pSVar4->binary_[pSVar4->idx_] == '\0'))
        goto LAB_003b89b8;
        bVar10 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar10) {
          return false;
        }
        bVar10 = Char1(this,&local_69);
        if (!bVar10) {
          return false;
        }
        if (local_69 == sep) {
          bVar10 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar10) {
            return false;
          }
          bVar10 = LookChar1(this,(char *)local_58);
          if (!bVar10) {
            return false;
          }
          iVar11 = 3;
          if (local_58[0] != end_symbol) goto LAB_003b8926;
        }
        else {
LAB_003b8926:
          if (local_69 != sep) {
            pSVar4 = this->_sr;
            if ((0 < (long)pSVar4->idx_) && (uVar12 = pSVar4->idx_ - 1, uVar12 <= pSVar4->length_))
            {
              pSVar4->idx_ = uVar12;
            }
            goto LAB_003b89b8;
          }
          bVar10 = SkipWhitespaceAndNewline(this,true);
          if (!bVar10) {
            return false;
          }
          bVar10 = ParseBasicTypeTuple<float,4ul>(this,(array<float,_4UL> *)local_58);
          if (bVar10) {
            auVar9._8_8_ = sStack_50;
            auVar9._0_8_ = CONCAT71(local_58._1_7_,local_58[0]);
            fVar6._M_elems = auVar9._4_12_;
            qVar7.real = (float)CONCAT71(local_58._1_7_,local_58[0]);
            qVar7.imag._M_elems[0] = fVar6._M_elems[0];
            qVar7.imag._M_elems[1] = fVar6._M_elems[1];
            qVar7.imag._M_elems[2] = fVar6._M_elems[2];
            iVar3._M_current =
                 (result->
                 super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            local_68 = qVar7;
            if (iVar3._M_current ==
                (result->
                super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>::
              _M_realloc_insert<tinyusdz::value::quatf_const&>
                        ((vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>> *)
                         result,iVar3,&local_68);
            }
            else {
              local_68.imag._M_elems._0_8_ = auVar9._4_8_;
              local_68._8_8_ = qVar7._8_8_;
              *(undefined8 *)((iVar3._M_current)->imag)._M_elems = local_68.imag._M_elems._0_8_;
              *(undefined8 *)(((iVar3._M_current)->imag)._M_elems + 2) = local_68._8_8_;
              ppqVar1 = &(result->
                         super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppqVar1 = *ppqVar1 + 1;
            }
            iVar11 = 0;
          }
          else {
            iVar11 = 3;
          }
        }
      } while (iVar11 == 0);
      if (iVar11 == 1) {
        return false;
      }
LAB_003b89b8:
      if ((result->
          super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (result->
          super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      local_58[0] = (char)&local_48;
      local_58._1_7_ = (undefined7)((ulong)&local_48 >> 8);
      pcVar14 = "Empty array.\n";
      pcVar13 = "";
    }
    else {
      local_58[0] = (char)&local_48;
      local_58._1_7_ = (undefined7)((ulong)&local_48 >> 8);
      pcVar14 = "Not starting with the value of requested type.\n";
      pcVar13 = "";
    }
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar14,pcVar13);
    PushError(this,(string *)local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_58._1_7_,local_58[0]) != &local_48) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_58._1_7_,local_58[0]),local_48._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}